

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O0

void phmap::priv::map_slot_policy<std::__cxx11::string,std::pair<unsigned_long,bool>>::
     construct<std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,bool>>>,std::piecewise_construct_t_const&,std::tuple<std::__cxx11::string_const&>,std::tuple<std::pair<unsigned_long,bool>&&>>
               (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>_>
                *alloc,slot_type *slot,piecewise_construct_t *args,
               tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               *args_1,tuple<std::pair<unsigned_long,_bool>_&&> *args_2)

{
  piecewise_construct_t *in_RCX;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>
  *in_RDX;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>_>
  *in_RSI;
  tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *in_R8;
  
  map_slot_policy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>
  ::emplace((slot_type *)0x146736);
  allocator_traits<std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,bool>>>>
  ::
  construct<std::pair<std::__cxx11::string,std::pair<unsigned_long,bool>>,std::piecewise_construct_t_const&,std::tuple<std::__cxx11::string_const&>,std::tuple<std::pair<unsigned_long,bool>&&>>
            (in_RSI,in_RDX,in_RCX,in_R8,(tuple<std::pair<unsigned_long,_bool>_&&> *)0x146753);
  return;
}

Assistant:

static void construct(Allocator* alloc, slot_type* slot, Args&&... args)
			{
				emplace(slot);
				if (kMutableKeys::value) {
					phmap::allocator_traits<Allocator>::construct(*alloc, &slot->mutable_value,
					        std::forward<Args>(args)...);
				}
				else {
					phmap::allocator_traits<Allocator>::construct(*alloc, &slot->value,
					        std::forward<Args>(args)...);
				}
			}